

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O3

void __thiscall
iutest::detail::AtMatcher<iutest::detail::GtMatcher<int>_>::~AtMatcher
          (AtMatcher<iutest::detail::GtMatcher<int>_> *this)

{
  operator_delete(this,0x20);
  return;
}

Assistant:

class AtMatcher IUTEST_CXX_FINAL : public IMatcher
{
public:
    AtMatcher(size_t index, const T& expected) : m_index(index), m_expected(expected) {}

public:
    template<typename U>
    AssertionResult operator ()(const U& actual)
    {
        if IUTEST_COND_LIKELY( CastToMatcher(m_expected)(actual[m_index]) )
        {
            return AssertionSuccess();
        }
        return AssertionFailure() << WhichIs();
    }

public:
    ::std::string WhichIs() const IUTEST_CXX_OVERRIDE
    {
        iu_global_format_stringstream strm;
        strm << "At " << m_index << ": " << m_expected;
        return strm.str();
    }